

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitStructRMW(InternalAnalyzer *this,StructRMW *curr)

{
  bool bVar1;
  StructRMW *curr_local;
  InternalAnalyzer *this_local;
  
  bVar1 = Type::isNull((Type *)(*(long *)(curr + 0x18) + 8));
  if (bVar1) {
    this->parent->trap = true;
  }
  else {
    this->parent->readsMutableStruct = true;
    this->parent->writesStruct = true;
    bVar1 = Type::isNullable((Type *)(*(long *)(curr + 0x18) + 8));
    if (bVar1) {
      this->parent->implicitTrap = true;
    }
    if (*(int *)(curr + 0x28) == 0) {
      __assert_fail("curr->order != MemoryOrder::Unordered",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/effects.h"
                    ,0x390,
                    "void wasm::EffectAnalyzer::InternalAnalyzer::visitStructRMW(StructRMW *)");
    }
    this->parent->isAtomic = true;
  }
  return;
}

Assistant:

void visitStructRMW(StructRMW* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.readsMutableStruct = true;
      parent.writesStruct = true;
      if (curr->ref->type.isNullable()) {
        parent.implicitTrap = true;
      }
      assert(curr->order != MemoryOrder::Unordered);
      parent.isAtomic = true;
    }